

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O1

void __thiscall
QPlainTestLogger::printBenchmarkResultsHeader(QPlainTestLogger *this,QBenchmarkResult *result)

{
  int iVar1;
  char *pcVar2;
  undefined8 extraout_RAX;
  char16_t *pcVar3;
  char16_t *pcVar4;
  size_t __n;
  long in_FS_OFFSET;
  FixedBufString<1022> buf;
  QByteArray local_468;
  QString local_448;
  ulong local_430;
  char local_428 [1024];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_430,0xaa,0x408);
  local_430 = 0;
  local_428[0] = '\0';
  pcVar2 = QTestResult::currentTestObjectName();
  QString::toLatin1_helper(&local_448);
  if ((&(local_448.d.d)->super_QArrayData == (QArrayData *)0x0) ||
     (1 < ((local_448.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&local_448,(AllocationOption)local_448.d.size);
  }
  iVar1 = snprintf(local_428 + local_430,0x3ff - local_430,"%s: %s::%s","RESULT ",pcVar2,
                   local_448.d.ptr);
  local_430 = local_430 + (long)iVar1;
  if (&(local_448.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_448.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_448.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_448.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_448.d.d)->super_QArrayData,1,0x10);
    }
  }
  local_448.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_448.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_448.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = QTestResult::currentDataTag();
  QByteArray::QByteArray((QByteArray *)&local_448,pcVar2,-1);
  local_468.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_468.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_468.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = QTestResult::currentGlobalDataTag();
  QByteArray::QByteArray(&local_468,pcVar2,-1);
  if ((undefined1 *)local_468.d.size == (undefined1 *)0x0) {
LAB_00120d70:
    pcVar3 = local_448.d.ptr;
    if ((undefined1 *)local_448.d.size != (undefined1 *)0x0) {
LAB_00120d81:
      if (pcVar3 == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QByteArray::_empty;
      }
      iVar1 = snprintf(local_428 + local_430,0x3ff - local_430,":\"%s\":\n",pcVar3);
      goto LAB_00120dac;
    }
    __n = 2;
    if (0x3fe - local_430 < 2) {
      __n = 0x3fe - local_430;
    }
    memcpy(local_428 + local_430,":\n",__n);
    local_430 = __n + local_430;
    if (0x3ff < local_430) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        printBenchmarkResultsHeader();
        if (&(local_448.d.d)->super_QArrayData != (QArrayData *)0x0) {
          printBenchmarkResultsHeader();
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          _Unwind_Resume(extraout_RAX);
        }
      }
      goto LAB_00120f1b;
    }
    local_428[local_430] = '\0';
  }
  else {
    if ((undefined1 *)local_448.d.size == (undefined1 *)0x0) {
      pcVar3 = (char16_t *)local_468.d.ptr;
      if ((undefined1 *)local_468.d.size == (undefined1 *)0x0) goto LAB_00120d70;
      goto LAB_00120d81;
    }
    pcVar3 = (char16_t *)local_468.d.ptr;
    if ((char16_t *)local_468.d.ptr == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QByteArray::_empty;
    }
    pcVar4 = local_448.d.ptr;
    if (local_448.d.ptr == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QByteArray::_empty;
    }
    iVar1 = snprintf(local_428 + local_430,0x3ff - local_430,":\"%s:%s\":\n",pcVar3,pcVar4);
LAB_00120dac:
    local_430 = local_430 + (long)iVar1;
  }
  QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,local_428);
  if (&(local_468.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_468.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_468.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_468.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_468.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_448.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_448.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_448.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_448.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_448.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00120f1b:
  __stack_chk_fail();
}

Assistant:

void QPlainTestLogger::printBenchmarkResultsHeader(const QBenchmarkResult &result)
{
    FixedBufString<1022> buf;
    buf.appendf("%s: %s::%s", QTest::benchmarkResult2String(),
                QTestResult::currentTestObjectName(), result.context.slotName.toLatin1().data());

    QByteArray tag = QTestResult::currentDataTag();
    QByteArray gtag = QTestResult::currentGlobalDataTag();

    if (!gtag.isEmpty() && !tag.isEmpty())
        buf.appendf(":\"%s:%s\":\n", gtag.constData(), tag.constData());
    else if (!gtag.isEmpty())
        buf.appendf(":\"%s\":\n", gtag.constData());
    else if (!tag.isEmpty())
        buf.appendf(":\"%s\":\n", tag.constData());
    else
        buf.append(":\n");
    outputMessage(buf);
}